

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_preserve_unknown_enum.pb.cc
# Opt level: O3

void __thiscall proto3_preserve_unknown_enum_unittest::MyMessage::clear_o(MyMessage *this)

{
  (this->field_0)._impl_._oneof_case_[0] = 0;
  return;
}

Assistant:

void MyMessage::clear_o() {
// @@protoc_insertion_point(one_of_clear_start:proto3_preserve_unknown_enum_unittest.MyMessage)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  switch (o_case()) {
    case kOneofE1: {
      // No need to clear
      break;
    }
    case kOneofE2: {
      // No need to clear
      break;
    }
    case O_NOT_SET: {
      break;
    }
  }
  _impl_._oneof_case_[0] = O_NOT_SET;
}